

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void av1_setup_src_planes
               (MACROBLOCK *x,YV12_BUFFER_CONFIG *src,int mi_row,int mi_col,int num_planes,
               BLOCK_SIZE bsize)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  int is_uv;
  int i;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa4;
  BLOCK_SIZE in_stack_ffffffffffffffaf;
  buf_2d *in_stack_ffffffffffffffb0;
  undefined4 local_48;
  undefined4 local_3c;
  undefined3 in_stack_ffffffffffffffc8;
  int mi_col_00;
  
  mi_col_00 = CONCAT13(in_R9B,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x20b8) = in_RSI;
  local_3c = 0;
  while( true ) {
    local_48 = in_R8D;
    if (2 < in_R8D) {
      local_48 = 3;
    }
    if (local_48 <= local_3c) break;
    setup_pred_plane(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,
                     (uint8_t *)
                     CONCAT44(in_stack_ffffffffffffffa4,
                              *(undefined4 *)(in_RDI + (long)local_3c * 0xa30 + 0x1b4)),0,0,
                     in_stack_ffffffffffffff94,(uint)(0 < local_3c),mi_col_00,
                     (scale_factors *)CONCAT44(in_EDX,in_ECX),(int)in_RSI,(int)in_RDI);
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void av1_setup_src_planes(MACROBLOCK *x, const YV12_BUFFER_CONFIG *src,
                          int mi_row, int mi_col, const int num_planes,
                          BLOCK_SIZE bsize) {
  // Set current frame pointer.
  x->e_mbd.cur_buf = src;

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); i++) {
    const int is_uv = i > 0;
    setup_pred_plane(
        &x->plane[i].src, bsize, src->buffers[i], src->crop_widths[is_uv],
        src->crop_heights[is_uv], src->strides[is_uv], mi_row, mi_col, NULL,
        x->e_mbd.plane[i].subsampling_x, x->e_mbd.plane[i].subsampling_y);
  }
}